

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall
gdscpp::setSTR(gdscpp *this,vector<gdsSTR,_std::allocator<gdsSTR>_> *target_structure)

{
  vector<gdsSTR,_std::allocator<gdsSTR>_> vStack_28;
  
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector(&vStack_28,target_structure);
  push_back_STR(this,&vStack_28);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&vStack_28);
  return;
}

Assistant:

void gdscpp::setSTR(vector<gdsSTR> target_structure)
{
  this->push_back_STR(target_structure);
}